

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O0

bool comparesEqual(QJsonValue *lhs,QJsonValue *rhs)

{
  long lVar1;
  bool bVar2;
  Type TVar3;
  Type TVar4;
  qint64 qVar5;
  qint64 qVar6;
  QCborValue *in_RSI;
  QCborValue *in_RDI;
  long in_FS_OFFSET;
  double dVar7;
  double dVar8;
  QString *in_stack_ffffffffffffff48;
  QString *in_stack_ffffffffffffff50;
  QJsonValue *in_stack_ffffffffffffff78;
  bool local_59;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  TVar3 = QCborValue::type((QCborValue *)in_RDI);
  TVar4 = QCborValue::type((QCborValue *)in_RSI);
  if (TVar3 == TVar4) {
    TVar3 = QCborValue::type((QCborValue *)in_RDI);
    if (TVar3 == Integer) {
      qVar5 = QJsonPrivate::Value::valueHelper(in_RDI);
      qVar6 = QJsonPrivate::Value::valueHelper(in_RSI);
      local_59 = qVar5 == qVar6;
    }
    else if (TVar3 == String) {
      QJsonValue::toString(in_stack_ffffffffffffff78);
      QJsonValue::toString(in_stack_ffffffffffffff78);
      local_59 = operator==(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      QString::~QString((QString *)0x4a1cc2);
      QString::~QString((QString *)0x4a1ccf);
    }
    else if (TVar3 == Array) {
      QJsonValue::toArray(in_stack_ffffffffffffff78);
      QJsonValue::toArray(in_stack_ffffffffffffff78);
      local_59 = operator==((QJsonArray *)in_stack_ffffffffffffff50,
                            (QJsonArray *)in_stack_ffffffffffffff48);
      QJsonArray::~QJsonArray((QJsonArray *)0x4a1d41);
      QJsonArray::~QJsonArray((QJsonArray *)0x4a1d4b);
    }
    else if (TVar3 == Map) {
      QJsonValue::toObject(in_stack_ffffffffffffff78);
      QJsonValue::toObject(in_stack_ffffffffffffff78);
      local_59 = operator==((QJsonObject *)in_stack_ffffffffffffff50,
                            (QJsonObject *)in_stack_ffffffffffffff48);
      QJsonObject::~QJsonObject((QJsonObject *)0x4a1dd8);
      QJsonObject::~QJsonObject((QJsonObject *)0x4a1de2);
    }
    else if ((uint)(TVar3 + 0xfffffeec) < 4) {
      local_59 = true;
    }
    else if (TVar3 == Double) {
      dVar7 = QJsonValue::toDouble
                        ((QJsonValue *)in_stack_ffffffffffffff50,(double)in_stack_ffffffffffffff48);
      dVar8 = QJsonValue::toDouble
                        ((QJsonValue *)in_stack_ffffffffffffff50,(double)in_stack_ffffffffffffff48);
      local_59 = dVar7 == dVar8;
    }
    else {
      local_59 = false;
    }
  }
  else {
    bVar2 = QJsonValue::isDouble((QJsonValue *)0x4a1b32);
    if ((bVar2) && (bVar2 = QJsonValue::isDouble((QJsonValue *)0x4a1b42), bVar2)) {
      dVar7 = QJsonValue::toDouble
                        ((QJsonValue *)in_stack_ffffffffffffff50,(double)in_stack_ffffffffffffff48);
      dVar8 = QJsonValue::toDouble
                        ((QJsonValue *)in_stack_ffffffffffffff50,(double)in_stack_ffffffffffffff48);
      local_59 = dVar7 == dVar8;
    }
    else {
      local_59 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_59;
}

Assistant:

bool comparesEqual(const QJsonValue &lhs, const QJsonValue &rhs)
{
    if (lhs.value.type() != rhs.value.type()) {
        if (lhs.isDouble() && rhs.isDouble()) {
            // One value Cbor integer, one Cbor double, should interact as doubles.
            return lhs.toDouble() == rhs.toDouble();
        }
        return false;
    }

    switch (lhs.value.type()) {
    case QCborValue::Undefined:
    case QCborValue::Null:
    case QCborValue::True:
    case QCborValue::False:
        break;
    case QCborValue::Double:
        return lhs.toDouble() == rhs.toDouble();
    case QCborValue::Integer:
        return QJsonPrivate::Value::valueHelper(lhs.value)
                == QJsonPrivate::Value::valueHelper(rhs.value);
    case QCborValue::String:
        return lhs.toString() == rhs.toString();
    case QCborValue::Array:
        return lhs.toArray() == rhs.toArray();
    case QCborValue::Map:
        return lhs.toObject() == rhs.toObject();
    default:
        return false;
    }
    return true;
}